

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O2

int snprintf_error_data(char *buf,size_t len,uint8_t err,char **arr,int arr_len)

{
  uint uVar1;
  undefined7 in_register_00000011;
  int iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  iVar2 = 0;
  if (len != 0 && (int)CONCAT71(in_register_00000011,err) != 0) {
    if (arr_len < 1) {
      arr_len = 0;
    }
    iVar2 = 0;
    iVar4 = 0;
    for (uVar3 = 0; (uint)arr_len != uVar3; uVar3 = uVar3 + 1) {
      if ((err >> ((uint)uVar3 & 0x1f) & 1) != 0) {
        if (iVar4 != 0) {
          uVar5 = len - (long)iVar2;
          uVar1 = snprintf(buf + iVar2,uVar5,",");
          if ((int)uVar1 < 0) {
            return iVar2;
          }
          if (uVar5 <= uVar1) {
            return iVar2;
          }
          iVar2 = iVar2 + uVar1;
        }
        uVar5 = len - (long)iVar2;
        uVar1 = snprintf(buf + iVar2,uVar5,"%s",arr[uVar3]);
        if ((int)uVar1 < 0) {
          return iVar2;
        }
        if (uVar5 <= uVar1) {
          return iVar2;
        }
        iVar2 = iVar2 + uVar1;
        iVar4 = iVar4 + 1;
      }
    }
  }
  return iVar2;
}

Assistant:

static int snprintf_error_data(char *buf, size_t len, uint8_t err,
			       const char **arr, int arr_len)
{
	int i, n = 0, count = 0;

	if (!err || len <= 0)
		return 0;

	for (i = 0; i < arr_len; i++) {
		if (err & (1 << i)) {
			int tmp_n = 0;
			if (count) {
				/* Fix for potential buffer overflow https://lgtm.com/rules/1505913226124/ */
				tmp_n = snprintf(buf + n, len - n, ",");
				if (tmp_n < 0 || (size_t)tmp_n >= len - n) {
					return n;
				}
				n += tmp_n;
			}
			tmp_n = snprintf(buf + n, len - n, "%s", arr[i]);
			if (tmp_n < 0 || (size_t)tmp_n >= len - n) {
				return n;
			}
			n += tmp_n;
			count++;
		}
	}

	return n;
}